

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O3

void sort_tables(ecs_world_t *world,ecs_query_t *query)

{
  int iVar1;
  ecs_compare_action_t compare;
  ecs_entity_t entity;
  ecs_table_t *table;
  ecs_column_t *peVar2;
  bool bVar3;
  uint uVar4;
  int32_t iVar5;
  int32_t iVar6;
  void *pvVar7;
  int32_t *piVar8;
  ecs_data_t *data;
  ecs_entity_t *entities;
  void *ptr;
  short offset;
  int32_t elem_size;
  long lVar9;
  bool bVar10;
  
  compare = query->compare;
  if (compare == (ecs_compare_action_t)0x0) {
    return;
  }
  entity = query->sort_on_component;
  uVar4 = ecs_vector_count(query->tables);
  pvVar7 = _ecs_vector_first(query->tables,0x50,0x10);
  if (0 < (int)uVar4) {
    lVar9 = 0;
    bVar3 = false;
    do {
      table = *(ecs_table_t **)((long)pvVar7 + lVar9 + 8);
      if (*(long *)((long)pvVar7 + lVar9 + 0x40) == 0) {
        piVar8 = ecs_table_get_monitor(table);
        *(int32_t **)((long)pvVar7 + lVar9 + 0x40) = piVar8;
        piVar8 = ecs_table_get_dirty_state(table);
        if (entity != 0) {
          bVar10 = true;
          goto LAB_00119f91;
        }
        iVar5 = -1;
LAB_0011a00c:
        data = ecs_table_get_data(table);
        bVar3 = true;
        if (((data != (ecs_data_t *)0x0) && (data->entities != (ecs_vector_t *)0x0)) &&
           (iVar6 = ecs_table_data_count(data), 1 < iVar6)) {
          entities = (ecs_entity_t *)_ecs_vector_first(data->entities,8,0x10);
          if (iVar5 == -1) {
            ptr = (void *)0x0;
            elem_size = 0;
          }
          else {
            peVar2 = data->columns;
            offset = peVar2[iVar5].alignment;
            if (offset < 0x11) {
              offset = 0x10;
            }
            elem_size = (int32_t)peVar2[iVar5].size;
            ptr = _ecs_vector_first(peVar2[iVar5].data,elem_size,offset);
          }
          qsort_array(world,table,data,entities,ptr,elem_size,0,iVar6 + -1,compare);
        }
      }
      else {
        piVar8 = ecs_table_get_dirty_state(table);
        iVar1 = **(int **)((long)pvVar7 + lVar9 + 0x40);
        bVar10 = *piVar8 != iVar1;
        if (entity == 0) {
          iVar5 = -1;
          if (*piVar8 != iVar1) goto LAB_0011a00c;
        }
        else {
LAB_00119f91:
          iVar5 = ecs_type_index_of(table->type,entity);
          if (iVar5 != -1) {
            iVar6 = ecs_vector_count(table->type);
            _ecs_assert(iVar5 < iVar6,0xc,(char *)0x0,"index < ecs_vector_count(table->type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x596);
            iVar6 = ecs_vector_count(table->type);
            if (iVar6 <= iVar5) {
              __assert_fail("index < ecs_vector_count(table->type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x596,"void sort_tables(ecs_world_t *, ecs_query_t *)");
            }
            if ((bVar10) ||
               (piVar8[(long)iVar5 + 1] !=
                *(int *)(*(long *)((long)pvVar7 + lVar9 + 0x40) + 4 + (long)iVar5 * 4)))
            goto LAB_0011a00c;
          }
        }
      }
      lVar9 = lVar9 + 0x50;
    } while ((ulong)uVar4 * 0x50 != lVar9);
    if (bVar3) goto LAB_0011a0f5;
  }
  if (query->match_count == query->prev_match_count) {
    return;
  }
LAB_0011a0f5:
  build_sorted_tables(query);
  query->match_count = query->match_count + 1;
  return;
}

Assistant:

static
void sort_tables(
    ecs_world_t *world,
    ecs_query_t *query)
{
    ecs_compare_action_t compare = query->compare;
    if (!compare) {
        return;
    }
    
    ecs_entity_t sort_on_component = query->sort_on_component;

    /* Iterate over active tables. Don't bother with inactive tables, since
     * they're empty */
    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);
    bool tables_sorted = false;

    for (i = 0; i < count; i ++) {
        ecs_matched_table_t *table_data = &tables[i];
        ecs_table_t *table = table_data->iter_data.table;

        /* If no monitor had been created for the table yet, create it now */
        bool is_dirty = false;
        if (!table_data->monitor) {
            table_data->monitor = ecs_table_get_monitor(table);

            /* A new table is always dirty */
            is_dirty = true;
        }

        int32_t *dirty_state = ecs_table_get_dirty_state(table);

        is_dirty = is_dirty || (dirty_state[0] != table_data->monitor[0]);

        int32_t index = -1;
        if (sort_on_component) {
            /* Get index of sorted component. We only care if the component we're
            * sorting on has changed or if entities have been added / re(moved) */
            index = ecs_type_index_of(table->type, sort_on_component);
            if (index != -1) {
                ecs_assert(index < ecs_vector_count(table->type), ECS_INTERNAL_ERROR, NULL); 
                is_dirty = is_dirty || (dirty_state[index + 1] != table_data->monitor[index + 1]);
            } else {
                /* Table does not contain component which means the sorted
                 * component is shared. Table does not need to be sorted */
                continue;
            }
        }      
        
        /* Check both if entities have moved (element 0) or if the component
         * we're sorting on has changed (index + 1) */
        if (is_dirty) {
            /* Sort the table */
            sort_table(world, table, index, compare);
            tables_sorted = true;
        }
    }

    if (tables_sorted || query->match_count != query->prev_match_count) {
        build_sorted_tables(query);
        query->match_count ++; /* Increase version if tables changed */
    }
}